

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledFile.cpp
# Opt level: O0

Metadata * PolledFile::Impl::readFileMetadata(Metadata *__return_storage_ptr__,char *filename)

{
  __syscall_slong_t _Var1;
  int iVar2;
  uint *puVar3;
  undefined1 local_a0 [4];
  int result;
  stat st;
  char *filename_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)filename;
  iVar2 = stat(filename,(stat *)local_a0);
  Metadata::Metadata(__return_storage_ptr__);
  _Var1 = st.__glibc_reserved[2];
  if (iVar2 == 0) {
    __return_storage_ptr__->size = st.st_rdev;
    (__return_storage_ptr__->time).tv_sec = st.st_atim.tv_nsec;
    (__return_storage_ptr__->time).tv_nsec = st.st_mtim.tv_sec;
  }
  else {
    puVar3 = (uint *)__errno_location();
    aAppDebugPrintf("Cannot read %s stat: errno=%d",_Var1,(ulong)*puVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static Metadata readFileMetadata(const char *filename) {
#ifdef _WIN32
		Metadata metadata;
		const HANDLE fh = CreateFileA(filename, GENERIC_READ, FILE_SHARE_READ, NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
		if (fh == INVALID_HANDLE_VALUE) {
			MSG("Cannot check file '%s' modification time: %x", filename, GetLastError());
			return metadata;
		}

		LARGE_INTEGER splurge_integer;
		if (!GetFileSizeEx(fh, &splurge_integer) || splurge_integer.QuadPart > 1024 * 1024) {
			MSG("Cannot get file '%s' size or size is too large", filename);
			goto exit;
		}

		FILETIME ft;
		if (!GetFileTime(fh, NULL, NULL, &ft)) {
			MSG("Cannot get file '%s' modification time", filename);
			goto exit;
		}

		metadata.size = splurge_integer.QuadPart;
		metadata.time = ft;

	exit:
		CloseHandle(fh);
		return metadata;
#else
		struct stat st;
		const int result = stat(filename, &st);
		Metadata metadata;
		if (result == 0) {
			metadata.size = st.st_size;
			metadata.time = st.st_mtim;
		} else
			MSG("Cannot read %s stat: errno=%d", filename, errno);
		return metadata;
#endif
	}